

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

regex_stack_var * __thiscall CRegexStack::new_reg_or_var(CRegexStack *this,int id)

{
  int *piVar1;
  char *ret;
  regex_stack_var *prVar2;
  regex_stack_var *prVar3;
  
  prVar2 = (regex_stack_var *)(this->buf_ + this->used_);
  prVar3 = (regex_stack_var *)(this->buf_ + (long)this->sp_ + 0x24);
  do {
    if (prVar2 <= prVar3) {
      this->used_ = this->used_ + 0xc;
      prVar2->id = id;
      return prVar2;
    }
    piVar1 = &prVar3->id;
    prVar3 = prVar3 + 1;
  } while (*piVar1 != id);
  return (regex_stack_var *)0x0;
}

Assistant:

regex_stack_var *new_reg_or_var(int id)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* scan the frame for a register/variable with this ID */
        regex_stack_var *var;
        for (var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* if this is the one, we don't need to save it again */
            if (var->id == id)
                return 0;
        }

        /* we didn't find it, so return a new entry with the given ID */
        var = (regex_stack_var *)alloc_space(sizeof(regex_stack_var));
        var->id = id;
        return var;
    }